

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qkeysequenceedit.cpp
# Opt level: O2

void __thiscall QKeySequenceEdit::setMaximumSequenceLength(QKeySequenceEdit *this,qsizetype count)

{
  QKeySequenceEditPrivate *this_00;
  qsizetype i;
  long lVar1;
  long in_FS_OFFSET;
  char local_28 [24];
  char *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (count - 5U < 0xfffffffffffffffc) {
    local_28[0] = '\x02';
    local_28[1] = '\0';
    local_28[2] = '\0';
    local_28[3] = '\0';
    local_28[0x14] = '\0';
    local_28[0x15] = '\0';
    local_28[0x16] = '\0';
    local_28[0x17] = '\0';
    local_28[4] = '\0';
    local_28[5] = '\0';
    local_28[6] = '\0';
    local_28[7] = '\0';
    local_28[8] = '\0';
    local_28[9] = '\0';
    local_28[10] = '\0';
    local_28[0xb] = '\0';
    local_28[0xc] = '\0';
    local_28[0xd] = '\0';
    local_28[0xe] = '\0';
    local_28[0xf] = '\0';
    local_28[0x10] = '\0';
    local_28[0x11] = '\0';
    local_28[0x12] = '\0';
    local_28[0x13] = '\0';
    local_10 = "default";
    QMessageLogger::warning
              (local_28,"QKeySequenceEdit: maximumSequenceLength %lld is out of range (1..%d)",count
               ,4);
  }
  else {
    this_00 = *(QKeySequenceEditPrivate **)(this + 8);
    this_00->maximumSequenceLength = (int)count;
    lVar1 = (long)this_00->keyNum;
    if (count < lVar1) {
      for (; lVar1 < count; lVar1 = lVar1 + 1) {
        this_00->key[lVar1].combination = 0;
      }
      this_00->keyNum = (int)count;
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        QKeySequenceEditPrivate::rebuildKeySequence(this_00);
        return;
      }
      goto LAB_003e0db9;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
LAB_003e0db9:
  __stack_chk_fail();
}

Assistant:

void QKeySequenceEdit::setMaximumSequenceLength(qsizetype count)
{
    Q_D(QKeySequenceEdit);

    if (count < 1 || count > QKeySequencePrivate::MaxKeyCount) {
        qWarning("QKeySequenceEdit: maximumSequenceLength %lld is out of range (1..%d)",
                 qlonglong(count), QKeySequencePrivate::MaxKeyCount);
        return;
    }
    d->maximumSequenceLength = int(count);
    if (d->keyNum > count) {
        for (qsizetype i = d->keyNum; i < count; ++i)
            d->key[i] = QKeyCombination::fromCombined(0);
        d->keyNum = count;
        d->rebuildKeySequence();
    }
}